

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__9,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  string_view format;
  Arg *in_stack_ffffffffffffff20;
  Arg local_d8;
  Arg local_a8;
  Arg local_78;
  Arg local_48;
  
  substitute_internal::Arg::Arg(&local_48,*(int *)(**(long **)this + 4));
  local_78.piece_._M_len = **(size_t **)(this + 8);
  local_78.piece_._M_str = (char *)(*(size_t **)(this + 8))[1];
  local_a8.piece_._M_len = (size_t)**(ushort **)(**(long **)(this + 0x10) + 8);
  local_a8.piece_._M_str =
       (char *)(~local_a8.piece_._M_len + (long)*(ushort **)(**(long **)(this + 0x10) + 8));
  local_d8.piece_._M_str = (char *)**(undefined8 **)(this + 0x18);
  local_d8.piece_._M_len = (*(undefined8 **)(this + 0x18))[1];
  format._M_str = (char *)&local_48;
  format._M_len = (size_t)"Field number $0 has already been used in \"$1\" by field \"$2\". $3.";
  Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&DAT_00000040,format,&local_78,&local_a8,
             &local_d8,in_stack_ffffffffffffff20);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}